

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O0

void __thiscall
diy::Master::Proxy::Proxy(Proxy *this,Master *master__,int gid__,IExchangeInfo *iexchange__)

{
  bool bVar1;
  CollectivesList *pCVar2;
  reference this_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int __type;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_bool> pVar3;
  accessor access;
  pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *x;
  iterator __end3;
  iterator __begin3;
  OutgoingQueues *__range3;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  Master *in_stack_ffffffffffffff10;
  pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *__args;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *this_01;
  resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
  local_88;
  pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *local_70;
  Proxy *in_stack_ffffffffffffffb0;
  
  *in_RDI = in_EDX;
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  *(undefined8 *)(in_RDI + 4) = in_RCX;
  std::
  map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::map((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
         *)0x177362);
  this_01 = (concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             *)(in_RDI + 0x12);
  std::
  map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
  ::map((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
         *)0x177375);
  pCVar2 = collectives(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  *(CollectivesList **)(in_RDI + 0x1e) = pCVar2;
  *(undefined1 *)(in_RDI + 0x22) = 0;
  fill_incoming(in_stack_ffffffffffffffb0);
  if (*(long *)(in_RDI + 4) == 0) {
    Master::outgoing(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::begin(this_01);
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::end(this_01);
    while( true ) {
      bVar1 = concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
              ::
              iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
              ::operator!=((iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                            *)in_stack_ffffffffffffff10,
                           (iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if (!bVar1) break;
      local_70 = concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                 ::
                 iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                 ::operator*((iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                              *)0x1774be);
      critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                *)&local_88,(char *)&local_70->second,__type);
      resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::operator->(&local_88);
      bVar1 = std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::empty
                        ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
                          *)0x1774f0);
      if (!bVar1) {
        in_stack_ffffffffffffff10 = (Master *)(in_RDI + 0x12);
        __args = local_70;
        resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
        ::operator->(&local_88);
        this_00 = std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
                  back((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *
                       )CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        QueueRecord::move(this_00);
        pVar3 = std::
                map<diy::BlockID,diy::MemoryBuffer,std::less<diy::BlockID>,std::allocator<std::pair<diy::BlockID_const,diy::MemoryBuffer>>>
                ::emplace<diy::BlockID_const&,diy::MemoryBuffer>
                          ((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                           &__args->first,(MemoryBuffer *)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff27 = pVar3.second;
        resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
        ::operator->(&local_88);
        std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::pop_back
                  ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                   in_stack_ffffffffffffff10);
      }
      resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::~resource_accessor
                ((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                  *)0x17759a);
      concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
      ::
      iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
      ::operator++((iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                    *)in_stack_ffffffffffffff10);
    }
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::
    iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
    ::~iterator_((iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                  *)0x177454);
    concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::
    iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
    ::~iterator_((iterator_<std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                  *)0x177461);
  }
  return;
}

Assistant:

Proxy(Master* master__, int gid__,
                              IExchangeInfo*  iexchange__ = 0):
                          gid_(gid__),
                          master_(master__),
                          iexchange_(iexchange__),
                          collectives_(&master__->collectives(gid__))
    {
        fill_incoming();

        // move outgoing_ back into proxy, in case it's a multi-foreach round
        if (!iexchange_)
            for (auto& x : master_->outgoing(gid_))
            {
                auto access = x.second.access();
                if (!access->empty())
                {
                    outgoing_.emplace(x.first, access->back().move());
                    access->pop_back();
                }
            }
    }